

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall fasttext::Loss::Loss(Loss *this,shared_ptr<fasttext::Matrix> *wo)

{
  iterator iVar1;
  int i;
  int iVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float local_30;
  float local_2c;
  
  this->_vptr_Loss = (_func_int **)&PTR__Loss_0014a978;
  (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->wo_ = wo;
  std::vector<float,_std::allocator<float>_>::reserve(&this->t_sigmoid_,0x201);
  iVar2 = 0;
  do {
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar3 = vxorps_avx512vl(ZEXT416((uint)((float)iVar2 * 0.001953125 + -8.0)),auVar3);
    fVar4 = expf(auVar3._0_4_);
    local_2c = 1.0 / (fVar4 + 1.0);
    iVar1._M_current =
         (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&this->t_sigmoid_,iVar1,&local_2c);
    }
    else {
      *iVar1._M_current = local_2c;
      (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    iVar2 = iVar2 + 0x10;
  } while (iVar2 != 0x2010);
  std::vector<float,_std::allocator<float>_>::reserve(&this->t_log_,0x201);
  iVar2 = 0;
  do {
    local_30 = logf(((float)iVar2 + 1e-05) * 0.001953125);
    iVar1._M_current =
         (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&this->t_log_,iVar1,&local_30);
    }
    else {
      *iVar1._M_current = local_30;
      (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x201);
  return;
}

Assistant:

Loss::Loss(std::shared_ptr<Matrix>& wo) : wo_(wo) {
  t_sigmoid_.reserve(SIGMOID_TABLE_SIZE + 1);
  for (int i = 0; i < SIGMOID_TABLE_SIZE + 1; i++) {
    real x = real(i * 2 * MAX_SIGMOID) / SIGMOID_TABLE_SIZE - MAX_SIGMOID;
    t_sigmoid_.push_back(1.0 / (1.0 + std::exp(-x)));
  }

  t_log_.reserve(LOG_TABLE_SIZE + 1);
  for (int i = 0; i < LOG_TABLE_SIZE + 1; i++) {
    real x = (real(i) + 1e-5) / LOG_TABLE_SIZE;
    t_log_.push_back(std::log(x));
  }
}